

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_zTXt(ucvector *out,char *keyword,char *textstring,
                  LodePNGCompressSettings *zlibsettings)

{
  ucvector *puVar1;
  LodePNGCompressSettings *settings;
  uint uVar2;
  uchar *puVar3;
  char *extraout_RAX;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  uchar *data;
  ulong uVar7;
  uchar uVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  ucvector compressed;
  uchar *local_78;
  size_t asStack_70 [2];
  char *local_60;
  char *local_58;
  uchar *local_50;
  ucvector *local_48;
  LodePNGCompressSettings *local_40;
  char *local_38;
  
  local_50 = (uchar *)textstring;
  local_48 = out;
  local_60 = (char *)strlen(textstring);
  local_78 = (uchar *)0x0;
  asStack_70[0] = 0;
  asStack_70[1] = 0;
  uVar8 = *keyword;
  if (uVar8 == '\0') goto LAB_00128290;
  uVar7 = 0xffffffffffffffff;
  pcVar6 = (char *)0x0;
  pcVar4 = (char *)0x0;
  data = (uchar *)0x0;
  pcVar9 = keyword;
  local_58 = local_60;
  local_40 = zlibsettings;
  do {
    local_60 = pcVar9;
    pcVar9 = pcVar4 + 1;
    puVar3 = data;
    pcVar5 = pcVar6;
    if (pcVar6 < pcVar9) {
      pcVar5 = (char *)((ulong)((long)pcVar9 * 3) >> 1);
      if ((char *)((long)pcVar6 * 2) < pcVar9) {
        pcVar5 = pcVar9;
      }
      local_38 = pcVar4;
      puVar3 = (uchar *)realloc(data,(size_t)pcVar5);
      pcVar4 = local_38;
      if (puVar3 != (uchar *)0x0) goto LAB_001280bc;
    }
    else {
LAB_001280bc:
      (puVar3 + -1)[(long)pcVar9] = uVar8;
      data = puVar3;
      pcVar6 = pcVar5;
      pcVar4 = pcVar9;
    }
    settings = local_40;
    uVar8 = local_60[uVar7 + 2];
    uVar7 = uVar7 + 1;
    pcVar9 = local_60;
  } while (uVar8 != '\0');
  if (0x4e < uVar7) goto LAB_00128290;
  pcVar9 = pcVar4 + 1;
  puVar3 = data;
  pcVar5 = pcVar6;
  if (pcVar6 < pcVar9) {
    pcVar5 = (char *)((ulong)((long)pcVar9 * 3) >> 1);
    if ((char *)((long)pcVar6 * 2) < pcVar9) {
      pcVar5 = pcVar9;
    }
    puVar3 = (uchar *)realloc(data,(size_t)pcVar5);
    if (puVar3 != (uchar *)0x0) goto LAB_00128131;
  }
  else {
LAB_00128131:
    puVar3[(long)pcVar4] = '\0';
    pcVar11 = pcVar4 + 2;
    pcVar4 = pcVar9;
    pcVar6 = pcVar5;
    pcVar9 = pcVar11;
    data = puVar3;
  }
  puVar3 = data;
  pcVar5 = pcVar6;
  if (pcVar6 < pcVar9) {
    pcVar5 = (char *)((ulong)((long)pcVar9 * 3) >> 1);
    if ((char *)((long)pcVar6 * 2) < pcVar9) {
      pcVar5 = pcVar9;
    }
    puVar3 = (uchar *)realloc(data,(size_t)pcVar5);
    if (puVar3 != (uchar *)0x0) goto LAB_00128179;
  }
  else {
LAB_00128179:
    (puVar3 + -1)[(long)pcVar9] = '\0';
    pcVar4 = pcVar9;
    pcVar6 = pcVar5;
    data = puVar3;
  }
  if (settings->custom_zlib ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    uVar2 = lodepng_zlib_compress(&local_78,asStack_70,local_50,(size_t)local_58,settings);
  }
  else {
    uVar2 = (*settings->custom_zlib)(&local_78,asStack_70,local_50,(size_t)local_58,settings);
  }
  if (uVar2 == 0) {
    if (asStack_70[0] != 0) {
      sVar10 = 0;
      do {
        uVar8 = local_78[sVar10];
        pcVar9 = pcVar4 + 1;
        puVar3 = data;
        if (pcVar6 < pcVar9) {
          pcVar5 = (char *)((ulong)((long)pcVar9 * 3) >> 1);
          if ((char *)((long)pcVar6 * 2) < pcVar9) {
            pcVar5 = pcVar9;
          }
          local_60 = pcVar6;
          puVar3 = (uchar *)realloc(data,(size_t)pcVar5);
          pcVar6 = pcVar5;
          pcVar5 = local_60;
          if (puVar3 != (uchar *)0x0) goto LAB_00128225;
        }
        else {
LAB_00128225:
          (puVar3 + -1)[(long)pcVar9] = uVar8;
          pcVar4 = pcVar9;
          data = puVar3;
          pcVar5 = pcVar6;
        }
        sVar10 = sVar10 + 1;
        pcVar6 = pcVar5;
      } while (sVar10 != asStack_70[0]);
    }
    puVar1 = local_48;
    uVar2 = lodepng_chunk_create(&local_48->data,&local_48->size,(uint)pcVar4,"zTXt",data);
    if (uVar2 == 0) {
      puVar1->allocsize = puVar1->size;
    }
  }
  asStack_70[0] = 0;
  asStack_70[1] = 0;
  free(local_78);
  local_78 = (uchar *)0x0;
  free(data);
  local_60 = extraout_RAX;
LAB_00128290:
  return (uint)local_60;
}

Assistant:

static unsigned addChunk_zTXt(ucvector* out, const char* keyword, const char* textstring,
                              LodePNGCompressSettings* zlibsettings)
{
  unsigned error = 0;
  ucvector data, compressed;
  size_t i, textsize = strlen(textstring);

  ucvector_init(&data);
  ucvector_init(&compressed);
  for(i = 0; keyword[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&data, 0); /*0 termination char*/
  ucvector_push_back(&data, 0); /*compression method: 0*/

  error = zlib_compress(&compressed.data, &compressed.size,
                        (unsigned char*)textstring, textsize, zlibsettings);
  if(!error)
  {
    for(i = 0; i != compressed.size; ++i) ucvector_push_back(&data, compressed.data[i]);
    error = addChunk(out, "zTXt", data.data, data.size);
  }

  ucvector_cleanup(&compressed);
  ucvector_cleanup(&data);
  return error;
}